

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kissfft.hh
# Opt level: O0

void __thiscall
kissfft<double>::kf_bfly_generic(kissfft<double> *this,cpx_t *Fout,size_t fstride,size_t m,size_t p)

{
  cpx_t *pcVar1;
  cpx_t *pcVar2;
  undefined8 *puVar3;
  reference pvVar4;
  complex<double> local_78;
  cpx_t *local_68;
  size_t q;
  size_t twidx;
  size_t q1_1;
  size_t q1;
  size_t k;
  size_t u;
  cpx_t *twiddles;
  size_t p_local;
  size_t m_local;
  size_t fstride_local;
  cpx_t *Fout_local;
  kissfft<double> *this_local;
  
  twiddles = (cpx_t *)p;
  p_local = m;
  m_local = fstride;
  fstride_local = (size_t)Fout;
  Fout_local = (cpx_t *)this;
  u = (size_t)std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                        (&this->_twiddles,0);
  pcVar1 = twiddles;
  pcVar2 = (cpx_t *)std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                              (&this->_scratchbuf);
  if (pcVar2 < pcVar1) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (&this->_scratchbuf,(size_type)twiddles);
  }
  for (k = 0; k < p_local; k = k + 1) {
    q1 = k;
    for (q1_1 = 0; q1_1 < twiddles; q1_1 = q1_1 + 1) {
      puVar3 = (undefined8 *)(fstride_local + q1 * 0x10);
      pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         (&this->_scratchbuf,q1_1);
      *(undefined8 *)pvVar4->_M_value = *puVar3;
      *(undefined8 *)(pvVar4->_M_value + 8) = puVar3[1];
      q1 = p_local + q1;
    }
    q1 = k;
    for (twidx = 0; twidx < twiddles; twidx = twidx + 1) {
      q = 0;
      pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         (&this->_scratchbuf,0);
      puVar3 = (undefined8 *)(fstride_local + q1 * 0x10);
      *puVar3 = *(undefined8 *)pvVar4->_M_value;
      puVar3[1] = *(undefined8 *)(pvVar4->_M_value + 8);
      for (local_68 = (cpx_t *)0x1; local_68 < twiddles;
          local_68 = (cpx_t *)(local_68->_M_value + 1)) {
        q = m_local * q1 + q;
        if (this->_nfft <= q) {
          q = q - this->_nfft;
        }
        pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 operator[](&this->_scratchbuf,(size_type)local_68);
        std::operator*(pvVar4,(complex<double> *)(u + q * 0x10));
        std::complex<double>::operator+=((complex<double> *)(fstride_local + q1 * 0x10),&local_78);
      }
      q1 = p_local + q1;
    }
  }
  return;
}

Assistant:

void kf_bfly_generic(
                cpx_t * const Fout,
                const size_t fstride,
                const std::size_t m,
                const std::size_t p
                ) const
        {
            const cpx_t * twiddles = &_twiddles[0];

            if(p > _scratchbuf.size()) _scratchbuf.resize(p);

            for ( std::size_t u=0; u<m; ++u ) {
                std::size_t k = u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    _scratchbuf[q1] = Fout[ k  ];
                    k += m;
                }

                k=u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    std::size_t twidx=0;
                    Fout[ k ] = _scratchbuf[0];
                    for ( std::size_t q=1;q<p;++q ) {
                        twidx += fstride * k;
                        if (twidx>=_nfft)
                          twidx-=_nfft;
                        Fout[ k ] += _scratchbuf[q] * twiddles[twidx];
                    }
                    k += m;
                }
            }
        }